

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx_main.cpp
# Opt level: O2

int __thiscall ktx::Tools::main(Tools *this,int argc,char **argv)

{
  OptionAdder *pOVar1;
  OptionValue *this_00;
  bool *pbVar2;
  size_t sVar3;
  bool testrun;
  int iVar4;
  Tools *pTVar5;
  string *arg_help;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  format_string<const_std::__cxx11::basic_string<char>_&> fmt;
  format_args args_00;
  format_string<const_std::__cxx11::basic_string<char>_&,_const_std::__cxx11::basic_string<char>_&>
  fmt_00;
  format_string<const_std::__cxx11::basic_string<char>_&> fmt_01;
  format_string<const_std::__cxx11::basic_string<char>_&,_char_*&> fmt_02;
  string_view fmt_03;
  allocator<char> local_4c2;
  allocator<char> local_4c1;
  allocator<char> local_4c0;
  allocator<char> local_4bf;
  allocator<char> local_4be;
  allocator<char> local_4bd;
  allocator<char> local_4bc;
  allocator<char> local_4bb;
  allocator<char> local_4ba;
  allocator<char> local_4b9;
  string local_4b8;
  shared_ptr<const_cxxopts::Value> local_498;
  element_type *local_488;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_480;
  shared_ptr<const_cxxopts::Value> local_478;
  Tools *local_460;
  element_type *local_458;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_450;
  shared_ptr<const_cxxopts::Value> local_448;
  element_type *local_438;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_430;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  undefined1 local_2e8 [184];
  ParseResult args;
  string local_178 [32];
  Options options;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"ktx",(allocator<char> *)&args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"",(allocator<char> *)local_2e8);
  cxxopts::Options::Options(&options,&local_308,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"[<command>] [OPTION...]",(allocator<char> *)&args);
  std::__cxx11::string::operator=((string *)&options.m_custom_help,local_178);
  std::__cxx11::string::~string(local_178);
  options.m_width = 100;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"",&local_4b9);
  cxxopts::Options::add_options((OptionAdder *)&args,&options,&local_348);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2e8,"h,help",&local_4ba);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,"Print this usage message and exit",&local_4bb);
  cxxopts::value<bool>();
  local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_488;
  local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_480._M_pi;
  local_488 = (element_type *)0x0;
  _Stack_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"",&local_4bc);
  pOVar1 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)&args,(string *)local_2e8,&local_4b8,&local_478,&local_368);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"v,version",&local_4bd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"Print the version number of this program and exit",&local_4be);
  local_460 = this;
  cxxopts::value<bool>();
  local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_438;
  local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_430._M_pi;
  local_438 = (element_type *)0x0;
  _Stack_430._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"",&local_4bf);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_388,&local_3a8,&local_498,&local_3c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"testrun",&local_4c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,
             "Indicates test run. If enabled the tool will produce deterministic output whenever possible"
             ,&local_4c1);
  cxxopts::value<bool>();
  local_448.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_458;
  local_448.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_450._M_pi;
  local_458 = (element_type *)0x0;
  _Stack_450._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"",&local_4c2);
  arg_help = &local_428;
  cxxopts::OptionAdder::operator()(pOVar1,&local_3e8,&local_408,&local_448,arg_help);
  std::__cxx11::string::~string((string *)&local_428);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_448.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_450);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_430);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_368);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_480);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)local_2e8);
  std::__cxx11::string::~string((string *)&args.m_keys._M_h._M_bucket_count);
  std::__cxx11::string::~string((string *)&local_348);
  options.m_allow_unrecognised = true;
  args.m_keys._M_h._M_buckets = &args.m_keys._M_h._M_single_bucket;
  args.m_keys._M_h._M_bucket_count = 1;
  args.m_keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  args.m_keys._M_h._M_element_count = 0;
  args.m_keys._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  args.m_keys._M_h._M_rehash_policy._4_4_ = 0;
  args.m_values._M_h._M_buckets = &args.m_values._M_h._M_single_bucket;
  args.m_keys._M_h._M_rehash_policy._M_next_resize = 0;
  args.m_keys._M_h._M_single_bucket = (__node_base_ptr)0x0;
  args.m_values._M_h._M_bucket_count = 1;
  args.m_values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  args.m_values._M_h._M_element_count = 0;
  args.m_values._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  args.m_values._M_h._M_rehash_policy._4_4_ = 0;
  args.m_values._M_h._M_rehash_policy._M_next_resize = 0;
  args.m_values._M_h._M_single_bucket = (__node_base_ptr)0x0;
  args.m_sequential.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.m_sequential.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args.m_sequential.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  args.m_defaults.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.m_defaults.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  args.m_defaults.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  args.m_unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.m_unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args.m_unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cxxopts::Options::parse((ParseResult *)local_2e8,&options,argc,argv);
  cxxopts::ParseResult::operator=(&args,(ParseResult *)local_2e8);
  cxxopts::ParseResult::~ParseResult((ParseResult *)local_2e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2e8,"testrun",(allocator<char> *)&local_4b8);
  pTVar5 = local_460;
  this_00 = cxxopts::ParseResult::operator[](&args,(string *)local_2e8);
  pbVar2 = cxxopts::OptionValue::as<bool>(this_00);
  pTVar5->testrun = *pbVar2;
  std::__cxx11::string::~string((string *)local_2e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2e8,"help",(allocator<char> *)&local_4b8);
  sVar3 = cxxopts::ParseResult::count(&args,(string *)local_2e8);
  std::__cxx11::string::~string((string *)local_2e8);
  if (sVar3 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2e8,"version",(allocator<char> *)&local_4b8);
    sVar3 = cxxopts::ParseResult::count(&args,(string *)local_2e8);
    std::__cxx11::string::~string((string *)local_2e8);
    if (sVar3 == 0) {
      if (args.m_unmatched.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          args.m_unmatched.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pTVar5 = (Tools *)&std::cerr;
        fmt_01.str_.size_ = (size_t)&options;
        fmt_01.str_.data_ = (char *)0x15;
        ::fmt::v10::print<std::__cxx11::string_const&>
                  ((v10 *)&std::cerr,(ostream *)"{}: Missing command.\n",fmt_01,
                   args.m_unmatched.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      else if (*argv[1] == '-') {
        pTVar5 = (Tools *)&std::cerr;
        fmt_00.str_.size_ = (size_t)&options;
        fmt_00.str_.data_ = (char *)0x20;
        ::fmt::v10::print<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  ((v10 *)&std::cerr,(ostream *)"{}: Unrecognized argument: \"{}\"\n",fmt_00,
                   args.m_unmatched.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,in_R9);
      }
      else {
        pTVar5 = (Tools *)&std::cerr;
        fmt_02.str_.size_ = (size_t)&options;
        fmt_02.str_.data_ = (char *)0x1f;
        ::fmt::v10::print<std::__cxx11::string_const&,char*&>
                  ((v10 *)&std::cerr,(ostream *)"{}: Unrecognized command: \"{}\"\n",fmt_02,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(argv + 1),
                   (char **)in_R9);
      }
      printUsage(pTVar5,(ostream *)&std::cerr,&options);
      iVar4 = 1;
    }
    else {
      version_abi_cxx11_(&local_4b8,(ktx *)(ulong)pTVar5->testrun,testrun);
      local_2e8._0_8_ = options.m_program._M_dataplus._M_p;
      local_2e8._8_8_ = options.m_program._M_string_length;
      local_2e8._16_8_ = local_4b8._M_dataplus._M_p;
      local_2e8._24_8_ = local_4b8._M_string_length;
      args_00.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_2e8;
      args_00.desc_ = 0xdd;
      fmt_03.size_ = 0xf;
      fmt_03.data_ = "{} version: {}\n";
      ::fmt::v10::vprint(fmt_03,args_00);
      std::__cxx11::string::~string((string *)&local_4b8);
      iVar4 = 0;
    }
  }
  else {
    pTVar5 = (Tools *)&std::cout;
    fmt.str_.size_ = (size_t)&options;
    fmt.str_.data_ = (char *)0x61;
    ::fmt::v10::print<std::__cxx11::string_const&>
              ((v10 *)&std::cout,
               (ostream *)
               "{}: Unified CLI frontend for the KTX-Software library with sub-commands for specific operations.\n"
               ,fmt,arg_help);
    iVar4 = 0;
    printUsage(pTVar5,(ostream *)&std::cout,&options);
  }
  cxxopts::ParseResult::~ParseResult(&args);
  cxxopts::Options::~Options(&options);
  return iVar4;
}

Assistant:

int Tools::main(int argc, char* argv[]) {
    cxxopts::Options options("ktx", "");
    options.custom_help("[<command>] [OPTION...]");
    options.set_width(CONSOLE_USAGE_WIDTH);
    options.add_options()
            ("h,help", "Print this usage message and exit")
            ("v,version", "Print the version number of this program and exit")
            ("testrun", "Indicates test run. If enabled the tool will produce deterministic output whenever possible");

    options.allow_unrecognised_options();

    cxxopts::ParseResult args;
    try {
        args = options.parse(argc, argv);
    } catch (const std::exception& ex) {
        fmt::print(std::cerr, "{}: {}\n", options.program(), ex.what());
        printUsage(std::cerr, options);
        return +rc::INVALID_ARGUMENTS;
    }

    testrun = args["testrun"].as<bool>();

    if (args.count("help")) {
        fmt::print(std::cout, "{}: Unified CLI frontend for the KTX-Software library with sub-commands for specific operations.\n", options.program());
        printUsage(std::cout, options);
        return +rc::SUCCESS;
    }

    if (args.count("version")) {
        fmt::print("{} version: {}\n", options.program(), version(testrun));
        return +rc::SUCCESS;
    }

    if (args.unmatched().empty()) {
        fmt::print(std::cerr, "{}: Missing command.\n", options.program());
        printUsage(std::cerr, options);
    } else {
        if (argv[1][0] != '-') {
            fmt::print(std::cerr, "{}: Unrecognized command: \"{}\"\n", options.program(), argv[1]);
        } else {
            fmt::print(std::cerr, "{}: Unrecognized argument: \"{}\"\n", options.program(), args.unmatched()[0]);
        }
        printUsage(std::cerr, options);
    }

    return +rc::INVALID_ARGUMENTS;
}